

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IReporter * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  IReporter *pIVar1;
  
  pIVar1 = (IReporter *)operator_new(0x150);
  *(undefined4 *)&pIVar1[1].super_IShared.super_NonCopyable._vptr_NonCopyable = 0;
  (pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__XmlReporter_001d5030;
  ReporterConfig::ReporterConfig((ReporterConfig *)(pIVar1 + 2),config);
  *(undefined2 *)&pIVar1[0x21].super_IShared.super_NonCopyable._vptr_NonCopyable = 0;
  pIVar1[0x22].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  pIVar1[0x23].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  pIVar1[0x24].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  pIVar1[0x25].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)(pIVar1 + 0x27);
  pIVar1[0x26].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  *(undefined1 *)&pIVar1[0x27].super_IShared.super_NonCopyable._vptr_NonCopyable = 0;
  pIVar1[0x29].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)&std::cout;
  return pIVar1;
}

Assistant:

virtual IReporter* create( const ReporterConfig& config ) const {
                return new T( config );
            }